

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callingconvetion.cpp
# Opt level: O3

void __thiscall
stackjit::CallingConvention::handleReturnValue
          (CallingConvention *this,FunctionCompilationData *functionData,
          FunctionDefinition *funcToCall)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters;
  Type *pTVar3;
  Amd64Assembler assembler;
  IntRegister local_30;
  IntRegister local_2c;
  Amd64Assembler local_28;
  
  data = ManagedFunction::generatedCode(functionData->function);
  Amd64Assembler::Amd64Assembler(&local_28,data);
  parameters = FunctionDefinition::parameters(funcToCall);
  iVar2 = anon_unknown_4::numStackArguments(parameters);
  if (0 < iVar2) {
    IntRegister::IntRegister(&local_2c,SP);
    Amd64Assembler::add(&local_28,local_2c,iVar2 << 3,false);
  }
  pTVar3 = FunctionDefinition::returnType(funcToCall);
  bVar1 = TypeSystem::isPrimitiveType(pTVar3,Void);
  if (!bVar1) {
    pTVar3 = FunctionDefinition::returnType(funcToCall);
    bVar1 = TypeSystem::isPrimitiveType(pTVar3,Float);
    if (bVar1) {
      OperandStack::pushReg(&functionData->operandStack,XMM0);
    }
    else {
      IntRegister::IntRegister(&local_30,AX);
      OperandStack::pushReg(&functionData->operandStack,local_30);
    }
  }
  return;
}

Assistant:

void CallingConvention::handleReturnValue(FunctionCompilationData& functionData, const FunctionDefinition& funcToCall) const {
		auto& generatedCode = functionData.function.generatedCode();
		auto& operandStack = functionData.operandStack;
		Amd64Assembler assembler(generatedCode);

		//If we have passed arguments via the stack, adjust the stack pointer.
		int numStackArgs = numStackArguments(funcToCall.parameters());

		if (numStackArgs > 0) {
			assembler.add(Registers::SP, numStackArgs * Amd64Backend::REGISTER_SIZE);
		}

		if (!TypeSystem::isPrimitiveType(funcToCall.returnType(), PrimitiveTypes::Void)) {
			//Push the return value
			if (TypeSystem::isPrimitiveType(funcToCall.returnType(), PrimitiveTypes::Float)) {
				operandStack.pushReg(FloatRegisterCallArguments::ReturnValue);
			} else {
				operandStack.pushReg(RegisterCallArguments::ReturnValue);
			}
		}
	}